

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopReportController.cpp
# Opt level: O0

QuerySpec * __thiscall
anon_unknown.dwarf_3fca37::LoopReportController::timeseries_spec
          (QuerySpec *__return_storage_ptr__,LoopReportController *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  CalQLParser local_2b0;
  string local_2a8;
  Log local_288;
  CalQLParser local_80;
  CalQLParser parser;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string query;
  char *q_cross;
  LoopReportController *this_local;
  
  query.field_2._8_8_ = anon_var_dwarf_3fcf66;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             " select Block,max(sum#loop.iterations) as \"Iterations\",max(scale#time.duration.ns) as \"Time (s)\",avg(ratio#loop.iterations/time.duration.ns) as \"Iter/s\" group by Block format table order by Block "
             ,&local_61);
  cali::ConfigManager::Options::build_query((string *)local_40,&this->m_opts,"cross",&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cali::CalQLParser::CalQLParser(&local_80,pcVar2);
  bVar1 = cali::CalQLParser::error(&local_80);
  if (bVar1) {
    cali::Log::Log(&local_288,0);
    poVar3 = cali::Log::stream(&local_288);
    cali::CalQLParser::error_msg_abi_cxx11_(&local_2a8,&local_80);
    poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_2a8);
    cali::Log::~Log(&local_288);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cali::CalQLParser::CalQLParser(&local_2b0,pcVar2);
  cali::CalQLParser::spec(__return_storage_ptr__,&local_2b0);
  cali::CalQLParser::~CalQLParser(&local_2b0);
  cali::CalQLParser::~CalQLParser(&local_80);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

QuerySpec timeseries_spec()
    {
        const char* q_cross =
            " select Block"
            ",max(sum#loop.iterations) as \"Iterations\""
            ",max(scale#time.duration.ns) as \"Time (s)\""
            ",avg(ratio#loop.iterations/time.duration.ns) as \"Iter/s\""
            " group by Block format table order by Block ";

        std::string query = m_opts.build_query("cross", q_cross);
        CalQLParser parser(query.c_str());

        if (parser.error())
            Log(0).stream() << parser.error_msg() << " " << query << std::endl;

        return CalQLParser(query.c_str()).spec();
    }